

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void * xmlParserNsLookupSax(xmlParserCtxtPtr ctxt,xmlChar *prefix)

{
  int iVar1;
  void *pvVar2;
  xmlHashedString local_20;
  
  pvVar2 = (void *)0x0;
  local_20.hashValue = 0;
  if (ctxt->str_xml != prefix) {
    local_20.name = prefix;
    if (prefix != (xmlChar *)0x0) {
      local_20.hashValue = xmlDictComputeHash(ctxt->dict,prefix);
    }
    pvVar2 = (void *)0x0;
    iVar1 = xmlParserNsLookup(ctxt,&local_20,(xmlParserNsBucket **)0x0);
    if (iVar1 != 0x7fffffff) {
      if (iVar1 < ctxt->nsdb->minNsIndex) {
        pvVar2 = (void *)0x0;
      }
      else {
        pvVar2 = ctxt->nsdb->extra[iVar1].saxData;
      }
    }
  }
  return pvVar2;
}

Assistant:

void *
xmlParserNsLookupSax(xmlParserCtxtPtr ctxt, const xmlChar *prefix) {
    xmlHashedString hprefix;
    int nsIndex;

    if (prefix == ctxt->str_xml)
        return(NULL);

    hprefix.name = prefix;
    if (prefix != NULL)
        hprefix.hashValue = xmlDictComputeHash(ctxt->dict, prefix);
    else
        hprefix.hashValue = 0;
    nsIndex = xmlParserNsLookup(ctxt, &hprefix, NULL);
    if ((nsIndex == INT_MAX) || (nsIndex < ctxt->nsdb->minNsIndex))
        return(NULL);

    return(ctxt->nsdb->extra[nsIndex].saxData);
}